

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmLocalGenerator *lg,
                   cmGeneratorExpressionContext *context,cmGeneratorTarget *headTarget,
                   cmGeneratorTarget *currentTarget,cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  cmCompiledGeneratorExpression *pcVar2;
  char *pcVar3;
  allocator local_9e;
  undefined1 local_9d;
  undefined1 local_90 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmGeneratorTarget *currentTarget_local;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorExpressionContext *context_local;
  cmLocalGenerator *lg_local;
  string *prop_local;
  string *result;
  
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&cge,&context->Backtrace);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_90,(string *)&cge);
  local_90._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_90);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_90._8_8_);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_90);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10));
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem
            (pcVar2,(bool)(context->EvaluateForBuildsystem & 1));
  local_9d = 0;
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10));
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,lg,&context->Config,(bool)(context->Quiet & 1),headTarget,currentTarget
                      ,dagChecker,&context->Language);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_9e);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10));
  bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadContextSensitiveCondition = true;
  }
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10));
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadHeadSensitiveCondition = true;
  }
  local_9d = 1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_90 + 0x10));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
    std::string const& prop, cmLocalGenerator *lg,
    cmGeneratorExpressionContext *context,
    cmGeneratorTarget const* headTarget,
    cmGeneratorTarget const* currentTarget,
    cmGeneratorExpressionDAGChecker *dagChecker)
{
  cmGeneratorExpression ge(context->Backtrace);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  std::string result = cge->Evaluate(lg,
                        context->Config,
                        context->Quiet,
                        headTarget,
                        currentTarget,
                        dagChecker,
                        context->Language);
  if (cge->GetHadContextSensitiveCondition())
    {
    context->HadContextSensitiveCondition = true;
    }
  if (cge->GetHadHeadSensitiveCondition())
    {
    context->HadHeadSensitiveCondition = true;
    }
  return result;
}